

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O0

void jpeg_make_d_derived_tbl(j_decompress_ptr cinfo,boolean isDC,int tblno,d_derived_tbl **pdtbl)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long *in_RCX;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  int sym;
  uint code;
  uint huffcode [257];
  char huffsize [257];
  int ctr;
  int lookbits;
  int numsymbols;
  int si;
  int l;
  int i;
  int p;
  d_derived_tbl *dtbl;
  JHUFF_TBL *htbl;
  long local_568;
  uint local_55c;
  uint auStack_558 [260];
  char local_148 [260];
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  uint local_30;
  int local_2c;
  long local_28;
  long local_20;
  long *local_18;
  int local_10;
  int local_c;
  long *local_8;
  
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  if ((in_EDX < 0) || (3 < in_EDX)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x32;
    *(int *)(*in_RDI + 0x2c) = in_EDX;
    (**(code **)*in_RDI)(in_RDI);
  }
  if (local_c == 0) {
    local_568 = local_8[(long)local_10 + 0x21];
  }
  else {
    local_568 = local_8[(long)local_10 + 0x1d];
  }
  local_20 = local_568;
  if (local_568 == 0) {
    *(undefined4 *)(*local_8 + 0x28) = 0x32;
    *(int *)(*local_8 + 0x2c) = local_10;
    (**(code **)*local_8)(local_8);
  }
  if (*local_18 == 0) {
    lVar3 = (**(code **)local_8[1])(local_8,1,0x528);
    *local_18 = lVar3;
  }
  local_28 = *local_18;
  *(long *)(*local_18 + 0x120) = local_20;
  local_2c = 0;
  for (local_34 = 1; local_34 < 0x11; local_34 = local_34 + 1) {
    local_30 = (uint)*(byte *)(local_20 + local_34);
    if (0x100 < (int)(local_2c + local_30)) {
      *(undefined4 *)(*local_8 + 0x28) = 8;
      (**(code **)*local_8)(local_8);
    }
    while (uVar1 = local_30, local_30 = local_30 - 1, uVar1 != 0) {
      lVar3 = (long)local_2c;
      local_2c = local_2c + 1;
      local_148[lVar3] = (char)local_34;
    }
  }
  local_148[local_2c] = '\0';
  local_3c = local_2c;
  local_55c = 0;
  local_38 = (int)local_148[0];
  local_2c = 0;
  while (local_148[local_2c] != '\0') {
    while (iVar2 = local_2c, local_148[local_2c] == local_38) {
      local_2c = local_2c + 1;
      auStack_558[iVar2] = local_55c;
      local_55c = local_55c + 1;
    }
    if (1L << ((byte)local_38 & 0x3f) <= (long)(ulong)local_55c) {
      *(undefined4 *)(*local_8 + 0x28) = 8;
      (**(code **)*local_8)(local_8);
    }
    local_55c = local_55c << 1;
    local_38 = local_38 + 1;
  }
  local_2c = 0;
  for (local_34 = 1; local_34 < 0x11; local_34 = local_34 + 1) {
    if (*(char *)(local_20 + local_34) == '\0') {
      *(undefined8 *)(local_28 + (long)local_34 * 8) = 0xffffffffffffffff;
    }
    else {
      *(ulong *)(local_28 + 0x90 + (long)local_34 * 8) =
           (long)local_2c - (ulong)auStack_558[local_2c];
      local_2c = (uint)*(byte *)(local_20 + local_34) + local_2c;
      *(ulong *)(local_28 + (long)local_34 * 8) = (ulong)auStack_558[local_2c + -1];
    }
  }
  *(undefined8 *)(local_28 + 0x118) = 0;
  *(undefined8 *)(local_28 + 0x88) = 0xfffff;
  for (local_30 = 0; (int)local_30 < 0x100; local_30 = local_30 + 1) {
    *(undefined4 *)(local_28 + 0x128 + (long)(int)local_30 * 4) = 0x900;
  }
  local_2c = 0;
  for (local_34 = 1; local_34 < 9; local_34 = local_34 + 1) {
    for (local_30 = 1; (int)local_30 <= (int)(uint)*(byte *)(local_20 + local_34);
        local_30 = local_30 + 1) {
      local_40 = auStack_558[local_2c] << (8U - (char)local_34 & 0x1f);
      for (local_44 = 1 << (8U - (char)local_34 & 0x1f); 0 < local_44; local_44 = local_44 + -1) {
        *(uint *)(local_28 + 0x128 + (long)local_40 * 4) =
             local_34 << 8 | (uint)*(byte *)(local_20 + 0x11 + (long)local_2c);
        local_40 = local_40 + 1;
      }
      local_2c = local_2c + 1;
    }
  }
  if (local_c != 0) {
    for (local_30 = 0; (int)local_30 < local_3c; local_30 = local_30 + 1) {
      if (0xf < *(byte *)(local_20 + 0x11 + (long)(int)local_30)) {
        *(undefined4 *)(*local_8 + 0x28) = 8;
        (**(code **)*local_8)(local_8);
      }
    }
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_make_d_derived_tbl(j_decompress_ptr cinfo, boolean isDC, int tblno,
                        d_derived_tbl **pdtbl)
{
  JHUFF_TBL *htbl;
  d_derived_tbl *dtbl;
  int p, i, l, si, numsymbols;
  int lookbits, ctr;
  char huffsize[257];
  unsigned int huffcode[257];
  unsigned int code;

  /* Note that huffsize[] and huffcode[] are filled in code-length order,
   * paralleling the order of the symbols themselves in htbl->huffval[].
   */

  /* Find the input Huffman table */
  if (tblno < 0 || tblno >= NUM_HUFF_TBLS)
    ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, tblno);
  htbl =
    isDC ? cinfo->dc_huff_tbl_ptrs[tblno] : cinfo->ac_huff_tbl_ptrs[tblno];
  if (htbl == NULL)
    ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, tblno);

  /* Allocate a workspace if we haven't already done so. */
  if (*pdtbl == NULL)
    *pdtbl = (d_derived_tbl *)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                  sizeof(d_derived_tbl));
  dtbl = *pdtbl;
  dtbl->pub = htbl;             /* fill in back link */

  /* Figure C.1: make table of Huffman code length for each symbol */

  p = 0;
  for (l = 1; l <= 16; l++) {
    i = (int)htbl->bits[l];
    if (i < 0 || p + i > 256)   /* protect against table overrun */
      ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);
    while (i--)
      huffsize[p++] = (char)l;
  }
  huffsize[p] = 0;
  numsymbols = p;

  /* Figure C.2: generate the codes themselves */
  /* We also validate that the counts represent a legal Huffman code tree. */

  code = 0;
  si = huffsize[0];
  p = 0;
  while (huffsize[p]) {
    while (((int)huffsize[p]) == si) {
      huffcode[p++] = code;
      code++;
    }
    /* code is now 1 more than the last code used for codelength si; but
     * it must still fit in si bits, since no code is allowed to be all ones.
     */
    if (((JLONG)code) >= (((JLONG)1) << si))
      ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);
    code <<= 1;
    si++;
  }

  /* Figure F.15: generate decoding tables for bit-sequential decoding */

  p = 0;
  for (l = 1; l <= 16; l++) {
    if (htbl->bits[l]) {
      /* valoffset[l] = huffval[] index of 1st symbol of code length l,
       * minus the minimum code of length l
       */
      dtbl->valoffset[l] = (JLONG)p - (JLONG)huffcode[p];
      p += htbl->bits[l];
      dtbl->maxcode[l] = huffcode[p - 1]; /* maximum code of length l */
    } else {
      dtbl->maxcode[l] = -1;    /* -1 if no codes of this length */
    }
  }
  dtbl->valoffset[17] = 0;
  dtbl->maxcode[17] = 0xFFFFFL; /* ensures jpeg_huff_decode terminates */

  /* Compute lookahead tables to speed up decoding.
   * First we set all the table entries to 0, indicating "too long";
   * then we iterate through the Huffman codes that are short enough and
   * fill in all the entries that correspond to bit sequences starting
   * with that code.
   */

  for (i = 0; i < (1 << HUFF_LOOKAHEAD); i++)
    dtbl->lookup[i] = (HUFF_LOOKAHEAD + 1) << HUFF_LOOKAHEAD;

  p = 0;
  for (l = 1; l <= HUFF_LOOKAHEAD; l++) {
    for (i = 1; i <= (int)htbl->bits[l]; i++, p++) {
      /* l = current code's length, p = its index in huffcode[] & huffval[]. */
      /* Generate left-justified code followed by all possible bit sequences */
      lookbits = huffcode[p] << (HUFF_LOOKAHEAD - l);
      for (ctr = 1 << (HUFF_LOOKAHEAD - l); ctr > 0; ctr--) {
        dtbl->lookup[lookbits] = (l << HUFF_LOOKAHEAD) | htbl->huffval[p];
        lookbits++;
      }
    }
  }

  /* Validate symbols as being reasonable.
   * For AC tables, we make no check, but accept all byte values 0..255.
   * For DC tables, we require the symbols to be in range 0..15.
   * (Tighter bounds could be applied depending on the data depth and mode,
   * but this is sufficient to ensure safe decoding.)
   */
  if (isDC) {
    for (i = 0; i < numsymbols; i++) {
      int sym = htbl->huffval[i];
      if (sym < 0 || sym > 15)
        ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);
    }
  }
}